

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manager.hpp
# Opt level: O1

pair<double,_double> __thiscall
manager::Manager<ttt::Board>::Match
          (Manager<ttt::Board> *this,longlong bot_id1,longlong bot_id2,int count)

{
  __buckets_ptr pp_Var1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  Board *pBVar4;
  double dVar5;
  undefined1 auVar6 [12];
  long *plVar7;
  _Hash_node_base *p_Var8;
  int iVar9;
  Board *this_00;
  long *plVar10;
  uint uVar11;
  __node_base_ptr p_Var12;
  __node_base_ptr p_Var13;
  __node_base_ptr p_Var14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined8 uVar18;
  undefined1 auVar17 [16];
  pair<double,_double> pVar19;
  IBot<ttt::Board> *bs [2];
  IMove move;
  undefined1 local_78 [16];
  long *local_68 [3];
  _Hash_node_base *local_50;
  _Hash_node_base *local_48;
  IMove local_40;
  Manager<ttt::Board> *local_38;
  
  pp_Var1 = (this->bots)._M_h._M_buckets;
  uVar2 = (this->bots)._M_h._M_bucket_count;
  p_Var13 = pp_Var1[(ulong)bot_id1 % uVar2];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var14 = p_Var13->_M_nxt, p_Var12 = p_Var13, p_Var14[1]._M_nxt != (_Hash_node_base *)bot_id1)
     ) {
    while (p_Var3 = p_Var14->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != (ulong)bot_id1 % uVar2) ||
         (p_Var12 = p_Var14, p_Var14 = p_Var3, p_Var3[1]._M_nxt == (_Hash_node_base *)bot_id1))
      goto LAB_001488a5;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_001488a5:
  if (p_Var12 == (__node_base_ptr)0x0) {
    local_48 = (_Hash_node_base *)0x0;
  }
  else {
    local_48 = p_Var12->_M_nxt;
  }
  p_Var13 = pp_Var1[(ulong)bot_id2 % uVar2];
  p_Var12 = (__node_base_ptr)0x0;
  if ((p_Var13 != (__node_base_ptr)0x0) &&
     (p_Var3 = p_Var13->_M_nxt, p_Var12 = p_Var13,
     p_Var13->_M_nxt[1]._M_nxt != (_Hash_node_base *)bot_id2)) {
    while (p_Var13 = p_Var3, p_Var3 = p_Var13->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
      p_Var12 = (__node_base_ptr)0x0;
      if (((ulong)p_Var3[1]._M_nxt % uVar2 != (ulong)bot_id2 % uVar2) ||
         (p_Var12 = p_Var13, p_Var3[1]._M_nxt == (_Hash_node_base *)bot_id2)) goto LAB_0014890f;
    }
    p_Var12 = (__node_base_ptr)0x0;
  }
LAB_0014890f:
  if (p_Var12 == (__node_base_ptr)0x0) {
    local_50 = (_Hash_node_base *)0x0;
  }
  else {
    local_50 = p_Var12->_M_nxt;
  }
  local_38 = this;
  if (count < 1) {
    local_78 = ZEXT816(0);
  }
  else {
    uVar11 = 0;
    local_78 = ZEXT816(0);
    do {
      this_00 = (Board *)operator_new(10);
      pBVar4 = local_38->game;
      *(undefined8 *)(this_00->board)._M_elems = *(undefined8 *)(pBVar4->board)._M_elems;
      *(undefined2 *)((this_00->board)._M_elems[2]._M_elems + 2) =
           *(undefined2 *)((pBVar4->board)._M_elems[2]._M_elems + 2);
      local_68[0] = (long *)0x0;
      local_68[1] = (long *)0x0;
      plVar10 = (long *)(*(code *)(local_48[2]._M_nxt[1]._M_nxt)->_M_nxt[2]._M_nxt)();
      uVar15 = uVar11 & 1;
      local_68[uVar15] = plVar10;
      plVar10 = (long *)(*(code *)(local_50[2]._M_nxt[1]._M_nxt)->_M_nxt[2]._M_nxt)();
      local_68[uVar15 ^ 1] = plVar10;
      iVar9 = ttt::Board::GetStatus(this_00);
      plVar7 = local_68[1];
      plVar10 = local_68[0];
      while (iVar9 == -1) {
        local_40 = (**(code **)(*plVar10 + 0x18))(plVar10);
        ttt::Board::ApplyMove(this_00,&local_40);
        (**(code **)(*plVar7 + 0x20))(plVar7,&local_40);
        iVar9 = ttt::Board::GetStatus(this_00);
        if (iVar9 != -1) break;
        local_40 = (**(code **)(*plVar7 + 0x18))(plVar7);
        ttt::Board::ApplyMove(this_00,&local_40);
        (**(code **)(*plVar10 + 0x20))(plVar10,&local_40);
        iVar9 = ttt::Board::GetStatus(this_00);
      }
      if (iVar9 == 1) {
        if (uVar15 != 0) goto LAB_00148a6e;
LAB_00148a53:
        dVar5 = (double)local_78._0_8_ + 1.0;
LAB_00148a61:
        uVar2 = (ulong)local_78._8_8_ >> 0x20;
        local_78._8_4_ = (int)local_78._8_8_;
        local_78._0_8_ = dVar5;
        local_78._12_4_ = (int)uVar2;
      }
      else {
        if (iVar9 == 0) {
          dVar5 = (double)local_78._0_8_ + 0.5;
          local_78._8_8_ = (double)local_78._8_8_ + 0.5;
          goto LAB_00148a61;
        }
        if (uVar15 != 0) goto LAB_00148a53;
LAB_00148a6e:
        local_78._8_8_ = (double)local_78._8_8_ + 1.0;
      }
      if (local_68[0] != (long *)0x0) {
        (**(code **)(*local_68[0] + 8))();
      }
      if (local_68[1] != (long *)0x0) {
        (**(code **)(*local_68[1] + 8))();
      }
      operator_delete(this_00);
      uVar11 = uVar11 + 1;
    } while (uVar11 != count);
  }
  p_Var8 = local_48;
  p_Var3 = local_50;
  dVar5 = (double)count;
  auVar16._8_4_ = SUB84(dVar5,0);
  auVar16._0_8_ = dVar5;
  auVar16._12_4_ = (int)((ulong)dVar5 >> 0x20);
  auVar16 = divpd(local_78,auVar16);
  uVar18 = 0;
  pVar19 = MM::operator()((MM *)local_68,(double)local_48[2]._M_nxt[2]._M_nxt,
                          (double)local_50[2]._M_nxt[2]._M_nxt,auVar16._0_8_);
  p_Var8[2]._M_nxt[2]._M_nxt = (_Hash_node_base *)pVar19.first;
  p_Var3[2]._M_nxt[2]._M_nxt = (_Hash_node_base *)pVar19.second;
  auVar6._4_8_ = uVar18;
  auVar6._0_4_ = auVar16._4_4_;
  auVar17._0_8_ = auVar6._0_8_ << 0x20;
  auVar17._8_4_ = auVar16._8_4_;
  auVar17._12_4_ = auVar16._12_4_;
  pVar19.second = auVar17._8_8_;
  pVar19.first = auVar16._0_8_;
  return pVar19;
}

Assistant:

std::pair<double, double>
Manager<IGame>::Match(long long bot_id1, long long bot_id2, int count)
{
    auto it1 = bots.find(bot_id1), it2 = bots.find(bot_id2);

    std::pair<double, double> results;

    for (int i = 0; i < count; ++i)
    {
        auto game_copy = new IGame(*game);
        game::IBot<IGame> *bs[2] = {};
        bs[i % 2] = it1->second->bot->Clone();
        bs[1 - i % 2] = it2->second->bot->Clone();
        int status = game_copy->GetStatus();
        while (status == game::Undecided)
        {
            auto move = bs[0]->MakeMove();
            game_copy->ApplyMove(move);
            bs[1]->SendMove(move);

            status = game_copy->GetStatus();
            if (status != game::Undecided)
                break;

            move = bs[1]->MakeMove();
            game_copy->ApplyMove(move);
            bs[0]->SendMove(move);

            status = game_copy->GetStatus();
        }

        if (status == game::Draw)
            results.first += 0.5, results.second += 0.5;
        else if (status == 1)
            i % 2 == 0 ? results.first += 1.0 : results.second += 1.0;
        else
            i % 2 == 0 ? results.second += 1.0 : results.first += 1.0;

        delete bs[0];
        delete bs[1];
        delete game_copy;
    }

    results.first /= count, results.second /= count;

    auto new_ratings = MM()(it1->second->rating, it2->second->rating, results.first);
    it1->second->rating = new_ratings.first, it2->second->rating = new_ratings.second;

    return results;
}